

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O2

void cfl_luma_subsampling_444_lbd_ssse3
               (uint8_t *input,int input_stride,uint16_t *pred_buf_q3,int width,int height)

{
  ulong uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 (*pauVar30) [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  
  pauVar30 = (undefined1 (*) [16])(pred_buf_q3 + (ulong)(uint)(height << 2) * 8);
  do {
    if (width == 8) {
      uVar1 = *(ulong *)*(undefined1 (*) [16])input;
      auVar3._8_6_ = 0;
      auVar3._0_8_ = uVar1;
      auVar3[0xe] = (char)(uVar1 >> 0x38);
      auVar6._8_4_ = 0;
      auVar6._0_8_ = uVar1;
      auVar6[0xc] = (char)(uVar1 >> 0x30);
      auVar6._13_2_ = auVar3._13_2_;
      auVar9._8_4_ = 0;
      auVar9._0_8_ = uVar1;
      auVar9._12_3_ = auVar6._12_3_;
      auVar12._8_2_ = 0;
      auVar12._0_8_ = uVar1;
      auVar12[10] = (char)(uVar1 >> 0x28);
      auVar12._11_4_ = auVar9._11_4_;
      auVar15._8_2_ = 0;
      auVar15._0_8_ = uVar1;
      auVar15._10_5_ = auVar12._10_5_;
      auVar18[8] = (char)(uVar1 >> 0x20);
      auVar18._0_8_ = uVar1;
      auVar18._9_6_ = auVar15._9_6_;
      auVar21._7_8_ = 0;
      auVar21._0_7_ = auVar18._8_7_;
      auVar24._1_8_ = SUB158(auVar21 << 0x40,7);
      auVar24[0] = (char)(uVar1 >> 0x18);
      auVar24._9_6_ = 0;
      auVar25._1_10_ = SUB1510(auVar24 << 0x30,5);
      auVar25[0] = (char)(uVar1 >> 0x10);
      auVar25._11_4_ = 0;
      auVar31._3_12_ = SUB1512(auVar25 << 0x20,3);
      auVar31[2] = (char)(uVar1 >> 8);
      auVar31[0] = (byte)uVar1;
      auVar31[1] = 0;
      auVar31[0xf] = 0;
      auVar31 = psllw(auVar31,3);
      *(undefined1 (*) [16])pred_buf_q3 = auVar31;
    }
    else if (width == 4) {
      uVar2 = *(undefined4 *)*(undefined1 (*) [16])input;
      auVar31 = psllw(ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte
                                                  )((uint)uVar2 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar2 >> 0x10),uVar2)) >>
                                                  0x20),uVar2) >> 0x18),(char)((uint)uVar2 >> 8)),
                                       (ushort)(byte)uVar2) & 0xffffff00ffffff),3);
      *(long *)*(undefined1 (*) [16])pred_buf_q3 = auVar31._0_8_;
    }
    else {
      auVar31 = *(undefined1 (*) [16])input;
      auVar4[0xd] = 0;
      auVar4._0_13_ = auVar31._0_13_;
      auVar4[0xe] = auVar31[7];
      auVar7[0xc] = auVar31[6];
      auVar7._0_12_ = auVar31._0_12_;
      auVar7._13_2_ = auVar4._13_2_;
      auVar10[0xb] = 0;
      auVar10._0_11_ = auVar31._0_11_;
      auVar10._12_3_ = auVar7._12_3_;
      auVar13[10] = auVar31[5];
      auVar13._0_10_ = auVar31._0_10_;
      auVar13._11_4_ = auVar10._11_4_;
      auVar16[9] = 0;
      auVar16._0_9_ = auVar31._0_9_;
      auVar16._10_5_ = auVar13._10_5_;
      auVar19[8] = auVar31[4];
      auVar19._0_8_ = auVar31._0_8_;
      auVar19._9_6_ = auVar16._9_6_;
      auVar22._7_8_ = 0;
      auVar22._0_7_ = auVar19._8_7_;
      auVar26._1_8_ = SUB158(auVar22 << 0x40,7);
      auVar26[0] = auVar31[3];
      auVar26._9_6_ = 0;
      auVar27._1_10_ = SUB1510(auVar26 << 0x30,5);
      auVar27[0] = auVar31[2];
      auVar27._11_4_ = 0;
      auVar34._3_12_ = SUB1512(auVar27 << 0x20,3);
      auVar34[2] = auVar31[1];
      auVar34[0] = auVar31[0];
      auVar34[1] = 0;
      auVar34[0xf] = 0;
      auVar32[1] = 0;
      auVar32[0] = auVar31[8];
      auVar32[2] = auVar31[9];
      auVar32[3] = 0;
      auVar32[4] = auVar31[10];
      auVar32[5] = 0;
      auVar32[6] = auVar31[0xb];
      auVar32[7] = 0;
      auVar32[8] = auVar31[0xc];
      auVar32[9] = 0;
      auVar32[10] = auVar31[0xd];
      auVar32[0xb] = 0;
      auVar32[0xc] = auVar31[0xe];
      auVar32[0xd] = 0;
      auVar32[0xe] = auVar31[0xf];
      auVar32[0xf] = 0;
      auVar31 = psllw(auVar34,3);
      *(undefined1 (*) [16])pred_buf_q3 = auVar31;
      auVar31 = psllw(auVar32,3);
      *(undefined1 (*) [16])((long)pred_buf_q3 + 0x10) = auVar31;
      if (width == 0x20) {
        auVar31 = *(undefined1 (*) [16])((long)input + 0x10);
        auVar5[0xd] = 0;
        auVar5._0_13_ = auVar31._0_13_;
        auVar5[0xe] = auVar31[7];
        auVar8[0xc] = auVar31[6];
        auVar8._0_12_ = auVar31._0_12_;
        auVar8._13_2_ = auVar5._13_2_;
        auVar11[0xb] = 0;
        auVar11._0_11_ = auVar31._0_11_;
        auVar11._12_3_ = auVar8._12_3_;
        auVar14[10] = auVar31[5];
        auVar14._0_10_ = auVar31._0_10_;
        auVar14._11_4_ = auVar11._11_4_;
        auVar17[9] = 0;
        auVar17._0_9_ = auVar31._0_9_;
        auVar17._10_5_ = auVar14._10_5_;
        auVar20[8] = auVar31[4];
        auVar20._0_8_ = auVar31._0_8_;
        auVar20._9_6_ = auVar17._9_6_;
        auVar23._7_8_ = 0;
        auVar23._0_7_ = auVar20._8_7_;
        auVar28._1_8_ = SUB158(auVar23 << 0x40,7);
        auVar28[0] = auVar31[3];
        auVar28._9_6_ = 0;
        auVar29._1_10_ = SUB1510(auVar28 << 0x30,5);
        auVar29[0] = auVar31[2];
        auVar29._11_4_ = 0;
        auVar35._3_12_ = SUB1512(auVar29 << 0x20,3);
        auVar35[2] = auVar31[1];
        auVar35[0] = auVar31[0];
        auVar35[1] = 0;
        auVar35[0xf] = 0;
        auVar33[1] = 0;
        auVar33[0] = auVar31[8];
        auVar33[2] = auVar31[9];
        auVar33[3] = 0;
        auVar33[4] = auVar31[10];
        auVar33[5] = 0;
        auVar33[6] = auVar31[0xb];
        auVar33[7] = 0;
        auVar33[8] = auVar31[0xc];
        auVar33[9] = 0;
        auVar33[10] = auVar31[0xd];
        auVar33[0xb] = 0;
        auVar33[0xc] = auVar31[0xe];
        auVar33[0xd] = 0;
        auVar33[0xe] = auVar31[0xf];
        auVar33[0xf] = 0;
        auVar31 = psllw(auVar35,3);
        *(undefined1 (*) [16])((long)pred_buf_q3 + 0x20) = auVar31;
        auVar31 = psllw(auVar33,3);
        *(undefined1 (*) [16])((long)pred_buf_q3 + 0x30) = auVar31;
      }
    }
    input = *(undefined1 (*) [16])input + input_stride;
    pred_buf_q3 = (uint16_t *)((long)pred_buf_q3 + 0x40);
  } while (pred_buf_q3 < pauVar30);
  return;
}

Assistant:

static inline void cfl_luma_subsampling_444_lbd_ssse3(const uint8_t *input,
                                                      int input_stride,
                                                      uint16_t *pred_buf_q3,
                                                      int width, int height) {
  const __m128i zeros = _mm_setzero_si128();
  const int luma_stride = input_stride;
  __m128i *pred_buf_m128i = (__m128i *)pred_buf_q3;
  const __m128i *end = pred_buf_m128i + height * CFL_BUF_LINE_I128;
  do {
    if (width == 4) {
      __m128i row = _mm_loadh_epi32((__m128i *)input);
      row = _mm_unpacklo_epi8(row, zeros);
      _mm_storel_epi64(pred_buf_m128i, _mm_slli_epi16(row, 3));
    } else if (width == 8) {
      __m128i row = _mm_loadl_epi64((__m128i *)input);
      row = _mm_unpacklo_epi8(row, zeros);
      _mm_storeu_si128(pred_buf_m128i, _mm_slli_epi16(row, 3));
    } else {
      __m128i row = _mm_loadu_si128((__m128i *)input);
      const __m128i row_lo = _mm_unpacklo_epi8(row, zeros);
      const __m128i row_hi = _mm_unpackhi_epi8(row, zeros);
      _mm_storeu_si128(pred_buf_m128i, _mm_slli_epi16(row_lo, 3));
      _mm_storeu_si128(pred_buf_m128i + 1, _mm_slli_epi16(row_hi, 3));
      if (width == 32) {
        __m128i row_1 = _mm_loadu_si128(((__m128i *)input) + 1);
        const __m128i row_1_lo = _mm_unpacklo_epi8(row_1, zeros);
        const __m128i row_1_hi = _mm_unpackhi_epi8(row_1, zeros);
        _mm_storeu_si128(pred_buf_m128i + 2, _mm_slli_epi16(row_1_lo, 3));
        _mm_storeu_si128(pred_buf_m128i + 3, _mm_slli_epi16(row_1_hi, 3));
      }
    }
    input += luma_stride;
    pred_buf_m128i += CFL_BUF_LINE_I128;
  } while (pred_buf_m128i < end);
}